

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall
Minisat::Option::Option
          (Option *this,char *name_,char *desc_,char *cate_,char *type_,bool tunable,
          Option *dependOn)

{
  undefined8 in_RCX;
  Option **in_RDX;
  undefined8 in_RSI;
  vec<Minisat::Option_*> *in_RDI;
  Option **in_R8;
  undefined4 uStack0000000000000008;
  undefined4 uStack000000000000000c;
  Option **in_stack_ffffffffffffffb8;
  
  in_RDI->data = (Option **)&PTR__Option_00179a60;
  in_RDI->sz = (int)in_RSI;
  in_RDI->cap = (int)((ulong)in_RSI >> 0x20);
  in_RDI[1].data = in_RDX;
  in_RDI[1].sz = (int)in_RCX;
  in_RDI[1].cap = (int)((ulong)in_RCX >> 0x20);
  in_RDI[2].data = in_R8;
  in_RDI[2].sz = uStack0000000000000008;
  in_RDI[2].cap = uStack000000000000000c;
  getOptionList();
  vec<Minisat::Option_*>::push(in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

Option(const char *name_,
           const char *desc_,
           const char *cate_,
           const char *type_,
           bool tunable = false,
           Option *dependOn = 0)
      : // push to this list, if present!
      name(name_)
      , description(desc_)
      , category(cate_)
      , type_name(type_)
      , dependOnNonDefaultOf(dependOn)
    {
        getOptionList().push(this);
    }